

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-writer2.hpp
# Opt level: O0

WriteNLResult * mp::WriteNLFile<mp::NLFeeder_Easy>(string *namebase,NLFeeder_Easy *nlf,NLUtils *utl)

{
  NLHeader h_00;
  NLHeader h_01;
  long lVar1;
  undefined8 in_RDX;
  undefined8 *puVar2;
  WriteNLResult *in_RDI;
  undefined8 *puVar3;
  byte bVar4;
  NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,_mp::NLFeeder_Easy>_> writer_1;
  NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_mp::NLFeeder_Easy>_> writer;
  NLHeader h;
  undefined8 uStackY_778;
  NLFeeder_Easy *in_stack_fffffffffffff890;
  string *in_stack_fffffffffffff8a0;
  NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_mp::NLFeeder_Easy>_> *in_stack_fffffffffffff8a8;
  NLUtils *in_stack_fffffffffffff8c0;
  FeederType *in_stack_fffffffffffff8c8;
  NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_mp::NLFeeder_Easy>_> *in_stack_fffffffffffff8d0;
  undefined1 auVar5 [168];
  undefined1 in_stack_fffffffffffff8e0 [184];
  undefined8 in_stack_fffffffffffff998;
  undefined8 *puVar6;
  undefined8 in_stack_fffffffffffff9a0;
  undefined8 in_stack_fffffffffffff9a8;
  undefined8 in_stack_fffffffffffff9b0;
  undefined8 in_stack_fffffffffffff9b8;
  undefined8 in_stack_fffffffffffff9c0;
  WriteNLResult *pWVar7;
  undefined1 in_stack_fffffffffffff9d8 [24];
  undefined1 local_518 [368];
  undefined8 local_3a8 [34];
  undefined1 local_298 [360];
  undefined1 local_130 [168];
  int local_88;
  undefined8 local_18;
  
  bVar4 = 0;
  pWVar7 = in_RDI;
  local_18 = in_RDX;
  NLFeeder_Easy::Header(in_stack_fffffffffffff890);
  if (local_88 == 0) {
    puVar6 = local_3a8;
    memcpy(puVar6,local_130,0x110);
    puVar2 = puVar6;
    puVar3 = &uStackY_778;
    for (lVar1 = 0x22; lVar1 != 0; lVar1 = lVar1 + -1) {
      *puVar3 = *puVar2;
      puVar2 = puVar2 + (ulong)bVar4 * -2 + 1;
      puVar3 = puVar3 + (ulong)bVar4 * -2 + 1;
    }
    h_00.super_NLInfo.super_NLInfo_C.ampl_options[1] = in_stack_fffffffffffff998;
    auVar5 = in_stack_fffffffffffff8e0._0_168_;
    h_00.super_NLProblemInfo.super_NLProblemInfo_C.num_vars = auVar5._0_4_;
    h_00.super_NLProblemInfo.super_NLProblemInfo_C.num_algebraic_cons = auVar5._4_4_;
    h_00.super_NLProblemInfo.super_NLProblemInfo_C.num_objs = auVar5._8_4_;
    h_00.super_NLProblemInfo.super_NLProblemInfo_C.num_ranges = auVar5._12_4_;
    h_00.super_NLProblemInfo.super_NLProblemInfo_C.num_eqns = auVar5._16_4_;
    h_00.super_NLProblemInfo.super_NLProblemInfo_C.num_logical_cons = auVar5._20_4_;
    h_00.super_NLProblemInfo.super_NLProblemInfo_C.num_rand_vars = auVar5._24_4_;
    h_00.super_NLProblemInfo.super_NLProblemInfo_C.num_rand_common_exprs = auVar5._28_4_;
    h_00.super_NLProblemInfo.super_NLProblemInfo_C.num_rand_cons = auVar5._32_4_;
    h_00.super_NLProblemInfo.super_NLProblemInfo_C.num_rand_objs = auVar5._36_4_;
    h_00.super_NLProblemInfo.super_NLProblemInfo_C.num_rand_calls = auVar5._40_4_;
    h_00.super_NLProblemInfo.super_NLProblemInfo_C.num_stages = auVar5._44_4_;
    h_00.super_NLProblemInfo.super_NLProblemInfo_C.num_nl_cons = auVar5._48_4_;
    h_00.super_NLProblemInfo.super_NLProblemInfo_C.num_nl_objs = auVar5._52_4_;
    h_00.super_NLProblemInfo.super_NLProblemInfo_C.num_compl_conds = auVar5._56_4_;
    h_00.super_NLProblemInfo.super_NLProblemInfo_C.num_nl_compl_conds = auVar5._60_4_;
    h_00.super_NLProblemInfo.super_NLProblemInfo_C.num_compl_dbl_ineqs = auVar5._64_4_;
    h_00.super_NLProblemInfo.super_NLProblemInfo_C.num_compl_vars_with_nz_lb = auVar5._68_4_;
    h_00.super_NLProblemInfo.super_NLProblemInfo_C.num_nl_net_cons = auVar5._72_4_;
    h_00.super_NLProblemInfo.super_NLProblemInfo_C.num_linear_net_cons = auVar5._76_4_;
    h_00.super_NLProblemInfo.super_NLProblemInfo_C.num_nl_vars_in_cons = auVar5._80_4_;
    h_00.super_NLProblemInfo.super_NLProblemInfo_C.num_nl_vars_in_objs = auVar5._84_4_;
    h_00.super_NLProblemInfo.super_NLProblemInfo_C.num_nl_vars_in_both = auVar5._88_4_;
    h_00.super_NLProblemInfo.super_NLProblemInfo_C.num_linear_net_vars = auVar5._92_4_;
    h_00.super_NLProblemInfo.super_NLProblemInfo_C.num_funcs = auVar5._96_4_;
    h_00.super_NLProblemInfo.super_NLProblemInfo_C.num_linear_binary_vars = auVar5._100_4_;
    h_00.super_NLProblemInfo.super_NLProblemInfo_C.num_linear_integer_vars = auVar5._104_4_;
    h_00.super_NLProblemInfo.super_NLProblemInfo_C.num_nl_integer_vars_in_both = auVar5._108_4_;
    h_00.super_NLProblemInfo.super_NLProblemInfo_C.num_nl_integer_vars_in_cons = auVar5._112_4_;
    h_00.super_NLProblemInfo.super_NLProblemInfo_C.num_nl_integer_vars_in_objs = auVar5._116_4_;
    h_00.super_NLProblemInfo.super_NLProblemInfo_C.num_con_nonzeros = auVar5._120_8_;
    h_00.super_NLProblemInfo.super_NLProblemInfo_C.num_obj_nonzeros = auVar5._128_8_;
    h_00.super_NLProblemInfo.super_NLProblemInfo_C.max_con_name_len = auVar5._136_4_;
    h_00.super_NLProblemInfo.super_NLProblemInfo_C.max_var_name_len = auVar5._140_4_;
    h_00.super_NLProblemInfo.super_NLProblemInfo_C.num_common_exprs_in_both = auVar5._144_4_;
    h_00.super_NLProblemInfo.super_NLProblemInfo_C.num_common_exprs_in_cons = auVar5._148_4_;
    h_00.super_NLProblemInfo.super_NLProblemInfo_C.num_common_exprs_in_objs = auVar5._152_4_;
    h_00.super_NLProblemInfo.super_NLProblemInfo_C.num_common_exprs_in_single_cons = auVar5._156_4_;
    h_00.super_NLProblemInfo.super_NLProblemInfo_C.num_common_exprs_in_single_objs = auVar5._160_4_;
    h_00.super_NLProblemInfo.super_NLProblemInfo_C._164_4_ = auVar5._164_4_;
    h_00.super_NLInfo.super_NLInfo_C.format = in_stack_fffffffffffff8e0._168_4_;
    h_00.super_NLInfo.super_NLInfo_C.num_ampl_options = in_stack_fffffffffffff8e0._172_4_;
    h_00.super_NLInfo.super_NLInfo_C.ampl_options[0] = in_stack_fffffffffffff8e0._176_8_;
    h_00.super_NLInfo.super_NLInfo_C.ampl_options[2] = in_stack_fffffffffffff9a0;
    h_00.super_NLInfo.super_NLInfo_C.ampl_options[3] = in_stack_fffffffffffff9a8;
    h_00.super_NLInfo.super_NLInfo_C.ampl_options[4] = (long)puVar6;
    h_00.super_NLInfo.super_NLInfo_C.ampl_options[5] = local_18;
    h_00.super_NLInfo.super_NLInfo_C.ampl_options[6] = (long)local_298;
    h_00.super_NLInfo.super_NLInfo_C.ampl_options[7] = (long)in_RDI;
    h_00.super_NLInfo.super_NLInfo_C.ampl_options[8] = (long)pWVar7;
    h_00.super_NLInfo.super_NLInfo_C.ampl_vbtol = (double)in_stack_fffffffffffff9d8._0_8_;
    h_00.super_NLInfo.super_NLInfo_C.prob_name = (char *)in_stack_fffffffffffff9d8._8_8_;
    h_00.super_NLInfo.super_NLInfo_C.arith_kind = in_stack_fffffffffffff9d8._16_4_;
    h_00.super_NLInfo.super_NLInfo_C.flags = in_stack_fffffffffffff9d8._20_4_;
    NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_mp::NLFeeder_Easy>_>::NLWriter2
              (in_stack_fffffffffffff8d0,in_stack_fffffffffffff8c8,h_00,in_stack_fffffffffffff8c0);
    NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_mp::NLFeeder_Easy>_>::WriteFiles
              (in_stack_fffffffffffff8a8,in_stack_fffffffffffff8a0);
    NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_mp::NLFeeder_Easy>_>::~NLWriter2
              ((NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_mp::NLFeeder_Easy>_> *)
               in_stack_fffffffffffff890);
  }
  else {
    puVar6 = (undefined8 *)&stack0xfffffffffffff9d8;
    memcpy(puVar6,local_130,0x110);
    puVar2 = puVar6;
    puVar3 = &uStackY_778;
    for (lVar1 = 0x22; lVar1 != 0; lVar1 = lVar1 + -1) {
      *puVar3 = *puVar2;
      puVar2 = puVar2 + (ulong)bVar4 * -2 + 1;
      puVar3 = puVar3 + (ulong)bVar4 * -2 + 1;
    }
    h_01.super_NLInfo.super_NLInfo_C.ampl_options[1] = (long)puVar6;
    auVar5 = in_stack_fffffffffffff8e0._0_168_;
    h_01.super_NLProblemInfo.super_NLProblemInfo_C.num_vars = auVar5._0_4_;
    h_01.super_NLProblemInfo.super_NLProblemInfo_C.num_algebraic_cons = auVar5._4_4_;
    h_01.super_NLProblemInfo.super_NLProblemInfo_C.num_objs = auVar5._8_4_;
    h_01.super_NLProblemInfo.super_NLProblemInfo_C.num_ranges = auVar5._12_4_;
    h_01.super_NLProblemInfo.super_NLProblemInfo_C.num_eqns = auVar5._16_4_;
    h_01.super_NLProblemInfo.super_NLProblemInfo_C.num_logical_cons = auVar5._20_4_;
    h_01.super_NLProblemInfo.super_NLProblemInfo_C.num_rand_vars = auVar5._24_4_;
    h_01.super_NLProblemInfo.super_NLProblemInfo_C.num_rand_common_exprs = auVar5._28_4_;
    h_01.super_NLProblemInfo.super_NLProblemInfo_C.num_rand_cons = auVar5._32_4_;
    h_01.super_NLProblemInfo.super_NLProblemInfo_C.num_rand_objs = auVar5._36_4_;
    h_01.super_NLProblemInfo.super_NLProblemInfo_C.num_rand_calls = auVar5._40_4_;
    h_01.super_NLProblemInfo.super_NLProblemInfo_C.num_stages = auVar5._44_4_;
    h_01.super_NLProblemInfo.super_NLProblemInfo_C.num_nl_cons = auVar5._48_4_;
    h_01.super_NLProblemInfo.super_NLProblemInfo_C.num_nl_objs = auVar5._52_4_;
    h_01.super_NLProblemInfo.super_NLProblemInfo_C.num_compl_conds = auVar5._56_4_;
    h_01.super_NLProblemInfo.super_NLProblemInfo_C.num_nl_compl_conds = auVar5._60_4_;
    h_01.super_NLProblemInfo.super_NLProblemInfo_C.num_compl_dbl_ineqs = auVar5._64_4_;
    h_01.super_NLProblemInfo.super_NLProblemInfo_C.num_compl_vars_with_nz_lb = auVar5._68_4_;
    h_01.super_NLProblemInfo.super_NLProblemInfo_C.num_nl_net_cons = auVar5._72_4_;
    h_01.super_NLProblemInfo.super_NLProblemInfo_C.num_linear_net_cons = auVar5._76_4_;
    h_01.super_NLProblemInfo.super_NLProblemInfo_C.num_nl_vars_in_cons = auVar5._80_4_;
    h_01.super_NLProblemInfo.super_NLProblemInfo_C.num_nl_vars_in_objs = auVar5._84_4_;
    h_01.super_NLProblemInfo.super_NLProblemInfo_C.num_nl_vars_in_both = auVar5._88_4_;
    h_01.super_NLProblemInfo.super_NLProblemInfo_C.num_linear_net_vars = auVar5._92_4_;
    h_01.super_NLProblemInfo.super_NLProblemInfo_C.num_funcs = auVar5._96_4_;
    h_01.super_NLProblemInfo.super_NLProblemInfo_C.num_linear_binary_vars = auVar5._100_4_;
    h_01.super_NLProblemInfo.super_NLProblemInfo_C.num_linear_integer_vars = auVar5._104_4_;
    h_01.super_NLProblemInfo.super_NLProblemInfo_C.num_nl_integer_vars_in_both = auVar5._108_4_;
    h_01.super_NLProblemInfo.super_NLProblemInfo_C.num_nl_integer_vars_in_cons = auVar5._112_4_;
    h_01.super_NLProblemInfo.super_NLProblemInfo_C.num_nl_integer_vars_in_objs = auVar5._116_4_;
    h_01.super_NLProblemInfo.super_NLProblemInfo_C.num_con_nonzeros = auVar5._120_8_;
    h_01.super_NLProblemInfo.super_NLProblemInfo_C.num_obj_nonzeros = auVar5._128_8_;
    h_01.super_NLProblemInfo.super_NLProblemInfo_C.max_con_name_len = auVar5._136_4_;
    h_01.super_NLProblemInfo.super_NLProblemInfo_C.max_var_name_len = auVar5._140_4_;
    h_01.super_NLProblemInfo.super_NLProblemInfo_C.num_common_exprs_in_both = auVar5._144_4_;
    h_01.super_NLProblemInfo.super_NLProblemInfo_C.num_common_exprs_in_cons = auVar5._148_4_;
    h_01.super_NLProblemInfo.super_NLProblemInfo_C.num_common_exprs_in_objs = auVar5._152_4_;
    h_01.super_NLProblemInfo.super_NLProblemInfo_C.num_common_exprs_in_single_cons = auVar5._156_4_;
    h_01.super_NLProblemInfo.super_NLProblemInfo_C.num_common_exprs_in_single_objs = auVar5._160_4_;
    h_01.super_NLProblemInfo.super_NLProblemInfo_C._164_4_ = auVar5._164_4_;
    h_01.super_NLInfo.super_NLInfo_C.format = in_stack_fffffffffffff8e0._168_4_;
    h_01.super_NLInfo.super_NLInfo_C.num_ampl_options = in_stack_fffffffffffff8e0._172_4_;
    h_01.super_NLInfo.super_NLInfo_C.ampl_options[0] = in_stack_fffffffffffff8e0._176_8_;
    h_01.super_NLInfo.super_NLInfo_C.ampl_options[2] = local_18;
    h_01.super_NLInfo.super_NLInfo_C.ampl_options[3] = (long)local_518;
    h_01.super_NLInfo.super_NLInfo_C.ampl_options[4] = in_stack_fffffffffffff9b0;
    h_01.super_NLInfo.super_NLInfo_C.ampl_options[5] = in_stack_fffffffffffff9b8;
    h_01.super_NLInfo.super_NLInfo_C.ampl_options[6] = in_stack_fffffffffffff9c0;
    h_01.super_NLInfo.super_NLInfo_C.ampl_options[7] = (long)in_RDI;
    h_01.super_NLInfo.super_NLInfo_C.ampl_options[8] = (long)pWVar7;
    h_01.super_NLInfo.super_NLInfo_C.ampl_vbtol = (double)in_stack_fffffffffffff9d8._0_8_;
    h_01.super_NLInfo.super_NLInfo_C.prob_name = (char *)in_stack_fffffffffffff9d8._8_8_;
    h_01.super_NLInfo.super_NLInfo_C.arith_kind = in_stack_fffffffffffff9d8._16_4_;
    h_01.super_NLInfo.super_NLInfo_C.flags = in_stack_fffffffffffff9d8._20_4_;
    NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,_mp::NLFeeder_Easy>_>::NLWriter2
              ((NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,_mp::NLFeeder_Easy>_> *)
               in_stack_fffffffffffff8d0,in_stack_fffffffffffff8c8,h_01,in_stack_fffffffffffff8c0);
    NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,_mp::NLFeeder_Easy>_>::WriteFiles
              ((NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,_mp::NLFeeder_Easy>_> *)
               in_stack_fffffffffffff8a8,in_stack_fffffffffffff8a0);
    NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,_mp::NLFeeder_Easy>_>::~NLWriter2
              ((NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,_mp::NLFeeder_Easy>_> *)
               in_stack_fffffffffffff890);
  }
  return pWVar7;
}

Assistant:

inline WriteNLResult WriteNLFile(
    const std::string& namebase,
    NLFeeder& nlf, NLUtils& utl) {
  auto h = nlf.Header();
  if (NLHeader::TEXT == h.format) {
    mp::NLWriter2<
        mp::NLWriter2Params<
        mp::TextFormatter, NLFeeder > >
        writer(nlf, h, utl);
    return writer.WriteFiles(namebase);
  } else {
    mp::NLWriter2<
        mp::NLWriter2Params<
        mp::BinaryFormatter, NLFeeder > >
        writer(nlf, h, utl);
    return writer.WriteFiles(namebase);
  }
}